

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O2

void __thiscall CGL::GLScene::Mesh::Mesh(Mesh *this,PolymeshInfo *polyMesh,Matrix4x4 *transform)

{
  undefined8 *puVar1;
  pointer pPVar2;
  BSDF *pBVar3;
  Polygon *p;
  pointer __x;
  ulong uVar4;
  long lVar5;
  vector<CGL::Vector3D,_std::allocator<CGL::Vector3D>_> vertices;
  vector<CGL::Vector2D,_std::allocator<CGL::Vector2D>_> texcoords;
  undefined8 uStack_a0;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  polygons;
  anon_union_32_3_e2189aaa_for_Vector4D_0 local_78;
  Vector4D local_58;
  
  (this->super_SceneObject)._vptr_SceneObject = (_func_int **)&PTR_set_draw_styles_0029f0b0;
  (this->super_MeshView)._vptr_MeshView = (_func_int **)&PTR_collapse_selected_edge_0029f158;
  (this->potentialFeature).bCoords.field_0.field_0.z = 0.0;
  (this->potentialFeature).bCoords.field_0.field_0.x = 0.0;
  (this->potentialFeature).bCoords.field_0.field_0.y = 0.0;
  (this->selectedFeature).element = (HalfedgeElement *)0x0;
  (this->selectedFeature).w = 0.0;
  *(undefined1 (*) [32])&(this->potentialFeature).element = ZEXT432(0) << 0x40;
  (this->hoveredFeature).bCoords.field_0.field_0.z = 0.0;
  *(undefined1 (*) [32])&(this->hoveredFeature).element = ZEXT432(0) << 0x40;
  (this->selectedFeature).bCoords.field_0.field_0.z = 0.0;
  HalfedgeMesh::HalfedgeMesh(&this->mesh);
  polygons.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  polygons.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  polygons.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pPVar2 = (polyMesh->polygons).
           super__Vector_base<CGL::Collada::Polygon,_std::allocator<CGL::Collada::Polygon>_>._M_impl
           .super__Vector_impl_data._M_finish;
  for (__x = (polyMesh->polygons).
             super__Vector_base<CGL::Collada::Polygon,_std::allocator<CGL::Collada::Polygon>_>.
             _M_impl.super__Vector_impl_data._M_start; __x != pPVar2; __x = __x + 1) {
    std::
    vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::push_back(&polygons,&__x->vertex_indices);
  }
  std::vector<CGL::Vector3D,_std::allocator<CGL::Vector3D>_>::vector(&vertices,&polyMesh->vertices);
  lVar5 = 0;
  for (uVar4 = 0;
      uVar4 < (ulong)((long)vertices.
                            super__Vector_base<CGL::Vector3D,_std::allocator<CGL::Vector3D>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)vertices.
                            super__Vector_base<CGL::Vector3D,_std::allocator<CGL::Vector3D>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 5); uVar4 = uVar4 + 1) {
    local_78.field_0.x =
         *(double *)
          ((long)&(vertices.super__Vector_base<CGL::Vector3D,_std::allocator<CGL::Vector3D>_>.
                   _M_impl.super__Vector_impl_data._M_start)->field_0 + lVar5);
    local_78.field_0.y =
         *(double *)
          ((long)&(vertices.super__Vector_base<CGL::Vector3D,_std::allocator<CGL::Vector3D>_>.
                   _M_impl.super__Vector_impl_data._M_start)->field_0 + lVar5 + 8);
    local_78.field_0.z =
         *(double *)
          ((long)&(vertices.super__Vector_base<CGL::Vector3D,_std::allocator<CGL::Vector3D>_>.
                   _M_impl.super__Vector_impl_data._M_start)->field_0 + lVar5 + 0x10);
    local_78.field_0.w = 1.0;
    Matrix4x4::operator*(transform,(Vector4D *)&local_78.field_0);
    Vector4D::projectTo3D(&local_58);
    puVar1 = (undefined8 *)
             ((long)&(vertices.super__Vector_base<CGL::Vector3D,_std::allocator<CGL::Vector3D>_>.
                      _M_impl.super__Vector_impl_data._M_start)->field_0 + lVar5);
    *puVar1 = texcoords.super__Vector_base<CGL::Vector2D,_std::allocator<CGL::Vector2D>_>._M_impl.
              super__Vector_impl_data._M_start;
    puVar1[1] = texcoords.super__Vector_base<CGL::Vector2D,_std::allocator<CGL::Vector2D>_>._M_impl.
                super__Vector_impl_data._M_finish;
    puVar1[2] = texcoords.super__Vector_base<CGL::Vector2D,_std::allocator<CGL::Vector2D>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
    puVar1[3] = uStack_a0;
    lVar5 = lVar5 + 0x20;
  }
  std::vector<CGL::Vector2D,_std::allocator<CGL::Vector2D>_>::vector
            (&texcoords,&polyMesh->texcoords);
  HalfedgeMesh::build(&this->mesh,&polygons,&vertices,&texcoords);
  if (polyMesh->material == (MaterialInfo *)0x0) {
    pBVar3 = (BSDF *)operator_new(0x50);
    pBVar3->_vptr_BSDF = (_func_int **)std::__detail::_Prime_rehash_policy::_M_need_rehash;
    pBVar3[1].reflectanceMap = (HDRImageBuffer *)0x3fe0000000000000;
    pBVar3[1].normalMap = (HDRImageBuffer *)0x3fe0000000000000;
    pBVar3[2]._vptr_BSDF = (_func_int **)0x3fe0000000000000;
    pBVar3[2].normalMap = (HDRImageBuffer *)&PTR__Sampler3D_0029f430;
  }
  else {
    pBVar3 = polyMesh->material->bsdf;
  }
  this->bsdf = pBVar3;
  std::_Vector_base<CGL::Vector2D,_std::allocator<CGL::Vector2D>_>::~_Vector_base
            (&texcoords.super__Vector_base<CGL::Vector2D,_std::allocator<CGL::Vector2D>_>);
  std::_Vector_base<CGL::Vector3D,_std::allocator<CGL::Vector3D>_>::~_Vector_base
            (&vertices.super__Vector_base<CGL::Vector3D,_std::allocator<CGL::Vector3D>_>);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector(&polygons);
  return;
}

Assistant:

Mesh::Mesh(Collada::PolymeshInfo& polyMesh, const Matrix4x4& transform) {

  // Build halfedge mesh from polygon soup
  vector< vector<size_t> > polygons;
  for (const Collada::Polygon& p : polyMesh.polygons) {
    polygons.push_back(p.vertex_indices);
  }
  vector<Vector3D> vertices = polyMesh.vertices; // DELIBERATE COPY.
  for (int i = 0; i < vertices.size(); i++) {
    vertices[i] = (transform * Vector4D(vertices[i], 1)).projectTo3D();
  }

  // Read texture coordinates.
  vector<Vector2D> texcoords = polyMesh.texcoords; // DELIBERATE COPY.

  mesh.build(polygons, vertices, texcoords);
  if (polyMesh.material) {
    bsdf = polyMesh.material->bsdf;
  } else {
    bsdf = new DiffuseBSDF(Vector3D(0.5f,0.5f,0.5f));
  }
}